

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O1

int WebPWriteYUV(FILE *fout,WebPDecBuffer *buffer)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  bool bVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  uint8_t *puVar8;
  uint8_t *__ptr;
  uint8_t *__ptr_00;
  int iVar9;
  int iVar10;
  
  uVar5 = 0;
  if (buffer != (WebPDecBuffer *)0x0 && fout != (FILE *)0x0) {
    puVar8 = (buffer->u).RGBA.rgba;
    __ptr_00 = (buffer->u).YUVA.u;
    __ptr = (buffer->u).YUVA.v;
    if (__ptr != (uint8_t *)0x0 && (__ptr_00 != (uint8_t *)0x0 && puVar8 != (uint8_t *)0x0)) {
      iVar1 = buffer->width;
      iVar2 = buffer->height;
      puVar3 = (buffer->u).YUVA.a;
      if (iVar2 < 1) {
        uVar5 = 1;
      }
      else {
        iVar9 = 1;
        do {
          sVar6 = fwrite(puVar8,(long)iVar1,1,(FILE *)fout);
          if (sVar6 != 1) break;
          puVar8 = puVar8 + (buffer->u).YUVA.y_stride;
          bVar4 = iVar9 < iVar2;
          iVar9 = iVar9 + 1;
        } while (bVar4);
        uVar5 = (uint)(sVar6 == 1);
      }
      iVar9 = (iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1;
      sVar6 = (size_t)((iVar1 - (iVar1 + 1 >> 0x1f)) + 1 >> 1);
      if ((0 < iVar2 & (byte)uVar5) == 1) {
        iVar10 = 1;
        do {
          sVar7 = fwrite(__ptr_00,sVar6,1,(FILE *)fout);
          if (sVar7 != 1) break;
          __ptr_00 = __ptr_00 + (buffer->u).YUVA.u_stride;
          bVar4 = iVar10 < iVar9;
          iVar10 = iVar10 + 1;
        } while (bVar4);
        uVar5 = (uint)(sVar7 == 1);
      }
      if ((0 < iVar2 & (byte)uVar5) == 1) {
        iVar10 = 1;
        do {
          sVar7 = fwrite(__ptr,sVar6,1,(FILE *)fout);
          if (sVar7 != 1) break;
          __ptr = __ptr + (buffer->u).YUVA.v_stride;
          bVar4 = iVar10 < iVar9;
          iVar10 = iVar10 + 1;
        } while (bVar4);
        uVar5 = (uint)(sVar7 == 1);
      }
      if (((0 < iVar2 && puVar3 != (uint8_t *)0x0) & (byte)uVar5) == 1) {
        puVar8 = puVar3;
        iVar9 = 1;
        do {
          sVar6 = fwrite(puVar8,(long)iVar1,1,(FILE *)fout);
          if ((sVar6 != 1) || (puVar3 == (uint8_t *)0x0)) break;
          puVar8 = puVar8 + (buffer->u).YUVA.a_stride;
          bVar4 = iVar9 < iVar2;
          iVar9 = iVar9 + 1;
        } while (bVar4);
        uVar5 = (uint)(sVar6 == 1);
      }
    }
  }
  return uVar5;
}

Assistant:

int WebPWriteYUV(FILE* fout, const WebPDecBuffer* const buffer) {
  if (fout == NULL || buffer == NULL) {
    return 0;
  } else {
    const int width = buffer->width;
    const int height = buffer->height;
    const WebPYUVABuffer* const yuv = &buffer->u.YUVA;
    const uint8_t* src_y = yuv->y;
    const uint8_t* src_u = yuv->u;
    const uint8_t* src_v = yuv->v;
    const uint8_t* src_a = yuv->a;
    const int uv_width = (width + 1) / 2;
    const int uv_height = (height + 1) / 2;
    const int a_height = (src_a != NULL) ? height : 0;
    int ok = 1;
    int y;

    if (src_y == NULL || src_u == NULL || src_v == NULL) return 0;

    for (y = 0; ok && y < height; ++y) {
      ok &= (fwrite(src_y, width, 1, fout) == 1);
      src_y += yuv->y_stride;
    }
    for (y = 0; ok && y < uv_height; ++y) {
      ok &= (fwrite(src_u, uv_width, 1, fout) == 1);
      src_u += yuv->u_stride;
    }
    for (y = 0; ok && y < uv_height; ++y) {
      ok &= (fwrite(src_v, uv_width, 1, fout) == 1);
      src_v += yuv->v_stride;
    }
    for (y = 0; ok && y < a_height; ++y) {
      ok &= (fwrite(src_a, width, 1, fout) == 1);
      src_a += yuv->a_stride;
    }
    return ok;
  }
}